

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O3

void hputcom(char *hstring,char *keyword,char *comment)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char line [100];
  char acStack_88 [104];
  
  sVar3 = strlen(keyword);
  if (((int)sVar3 == 7) &&
     ((iVar1 = strncmp(keyword,"COMMENT",7), iVar1 == 0 ||
      (iVar1 = strncmp(keyword,"HISTORY",7), iVar1 == 0)))) {
    pcVar5 = ksearch(hstring,"END");
    pcVar4 = pcVar5 + 0x50;
    strncpy(pcVar4,pcVar5,0x50);
    builtin_strncpy(pcVar5,
                    "                                                                                "
                    ,0x50);
    strncpy(pcVar5,keyword,7);
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar4 = ksearch(hstring,keyword);
    if (pcVar4 == (char *)0x0) {
      return;
    }
    strncpy(acStack_88,pcVar4,0x50);
    pcVar5 = strchr(acStack_88,0x27);
    if (((pcVar5 == (char *)0x0) || (pcVar5 = strchr(pcVar5 + 1,0x27), pcVar5 == (char *)0x0)) ||
       ((long)pcVar5 - (long)acStack_88 < 0x1f)) {
      pcVar5 = pcVar4 + 0x1f;
    }
    else {
      pcVar5 = pcVar4 + ((long)pcVar5 - (long)acStack_88) + 2;
    }
    pcVar4 = pcVar4 + 0x50;
    pcVar5[0] = '/';
    pcVar5[1] = ' ';
  }
  sVar3 = strlen(comment);
  uVar2 = (uint)sVar3;
  if (0 < (int)uVar2) {
    uVar6 = (int)pcVar4 - (int)(pcVar5 + 2);
    if (pcVar5 + (ulong)(uVar2 & 0x7fffffff) + 2 <= pcVar4) {
      uVar6 = uVar2;
    }
    strncpy(pcVar5 + 2,comment,(long)(int)uVar6);
  }
  return;
}

Assistant:

static void
hputcom (hstring,keyword,comment)

  char *hstring;
  char *keyword;
  char *comment;
{
	char squot;
	char line[100];
	int lkeyword, lcom;
	char *vp, *v1, *v2, *c0 = NULL, *c1, *q1, *q2;

	squot = 39;

/*  Find length of variable name */
	lkeyword = strlen (keyword);

/*  If COMMENT or HISTORY, always add it just before the END */
	if (lkeyword == 7 && (strncmp (keyword,"COMMENT",7) == 0 ||
	    strncmp (keyword,"HISTORY",7) == 0)) {

	/* Find end of header */
	    v1 = ksearch (hstring,"END");
	    v2 = v1 + 80;
	    strncpy (v2, v1, 80);

	/*  blank out new line and insert keyword */
	    for (vp = v1; vp < v2; vp++)
		*vp = ' ';
	    strncpy (v1, keyword, lkeyword);
	    }

/* search header string for variable name */
	else {
	    v1 = ksearch (hstring,keyword);
	    v2 = v1 + 80;

	/* if parameter is not found, return without doing anything */
	    if (v1 == NULL) {
		return;
		}

	/* otherwise, extract entry for this variable from the header */
	    strncpy (line, v1, 80);

	/* check for quoted value */
	    q1 = strchr (line,squot);
	    if (q1 != NULL)
		q2 = strchr (q1+1,squot);
	    else
		q2 = NULL;

	    if (q2 == NULL || q2-line < 31)
		c0 = v1 + 31;
	    else
		c0 = v1 + (q2-line) + 2; /* allan: 1997-09-30, was c0=q2+2 */

	    strncpy (c0, "/ ",2);
	    }

/* create new entry */
	lcom = strlen (comment);

	if (lcom > 0) {
	    c1 = c0 + 2;
	    if (c1+lcom > v2)
		lcom = v2 - c1;
	    strncpy (c1, comment, lcom);
	    }

}